

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadSubdivMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  ulong uVar1;
  bool bVar2;
  RTCSubdivisionMode RVar3;
  SubdivMeshNode *pSVar4;
  size_t sVar5;
  undefined8 in_RDX;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  Node *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  Ref<embree::XML> child_2;
  Ref<embree::XML> child_1;
  Ref<embree::XML> child;
  size_t i_10;
  avector<Vec3fa> vec;
  Ref<embree::XML> normalbuf;
  size_t i_7;
  Ref<embree::XML> animation_1;
  size_t i;
  Ref<embree::XML> animation;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh;
  Ref<embree::SceneGraph::MaterialNode> material;
  size_t i_11;
  size_t i_12;
  size_t i_9;
  size_t i_8;
  size_t i_5;
  size_t i_4;
  size_t i_6;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  value_type *in_stack_fffffffffffff158;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffff160;
  string *in_stack_fffffffffffff168;
  XML *in_stack_fffffffffffff170;
  string *in_stack_fffffffffffff190;
  XML *in_stack_fffffffffffff198;
  Ref<embree::XML> *in_stack_fffffffffffff1f0;
  allocator *paVar6;
  Ref<embree::XML> *in_stack_fffffffffffff200;
  Ref<embree::XML> *pRVar7;
  XMLLoader *in_stack_fffffffffffff208;
  string *in_stack_fffffffffffff218;
  XML *in_stack_fffffffffffff220;
  size_t in_stack_fffffffffffff228;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffff230;
  SubdivMeshNode *in_stack_fffffffffffff238;
  BBox1f in_stack_fffffffffffff240;
  XML *in_stack_fffffffffffff248;
  Ref<embree::XML> *in_stack_fffffffffffff280;
  XMLLoader *in_stack_fffffffffffff288;
  Ref<embree::XML> *in_stack_fffffffffffff370;
  XMLLoader *in_stack_fffffffffffff378;
  Ref<embree::XML> *in_stack_fffffffffffff420;
  XMLLoader *in_stack_fffffffffffff428;
  allocator local_a39;
  string local_a38 [32];
  long *local_a18;
  EVP_PKEY_CTX local_a10 [31];
  allocator local_9f1;
  string local_9f0 [32];
  long *local_9d0 [4];
  allocator local_9a9;
  string local_9a8 [32];
  Ref<embree::XML> local_988 [4];
  allocator local_961;
  string local_960 [32];
  long *local_940 [4];
  allocator local_919;
  string local_918 [32];
  long *local_8f8 [4];
  allocator local_8d1;
  string local_8d0 [32];
  long *local_8b0 [7];
  allocator local_871;
  string local_870 [32];
  Ref<embree::XML> local_850 [4];
  allocator local_829;
  string local_828 [32];
  long *local_808 [4];
  allocator local_7e1;
  string local_7e0 [32];
  long *local_7c0;
  allocator local_7b1;
  string local_7b0 [32];
  long *local_790 [4];
  ulong local_770;
  undefined1 local_768 [8];
  ulong local_760;
  undefined8 local_758;
  size_t local_750;
  allocator local_741;
  string local_740 [32];
  long *local_720;
  long *local_718;
  undefined1 local_710 [8];
  ulong local_708;
  undefined8 local_700;
  undefined8 local_6f8;
  ulong local_6f0;
  allocator local_6e1;
  string local_6e0 [32];
  long *local_6c0;
  allocator local_6b1;
  string local_6b0 [32];
  long *local_690;
  undefined1 local_688 [8];
  ulong local_680;
  undefined8 local_678;
  size_t local_670;
  allocator local_661;
  string local_660 [39];
  allocator local_639;
  string local_638 [32];
  long *local_618;
  undefined1 local_610 [8];
  ulong local_608;
  undefined8 local_600;
  size_t local_5f8;
  long *local_5f0;
  undefined1 local_5e8 [8];
  ulong local_5e0;
  undefined8 local_5d8;
  undefined8 local_5d0;
  ulong local_5c8;
  allocator local_5b9;
  string local_5b8 [32];
  long *local_598;
  undefined1 local_589;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  undefined4 uStack_57c;
  long *local_578;
  SubdivMeshNode *local_570 [3];
  allocator local_551;
  string local_550 [32];
  long *local_530;
  long *local_528;
  undefined8 local_520;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  Ref<embree::XML> *local_480;
  long **local_478;
  long **local_470;
  long **local_468;
  long **local_460;
  long **local_458;
  undefined1 *local_450;
  undefined1 *local_440;
  undefined1 *local_430;
  undefined1 *local_420;
  undefined1 *local_410;
  undefined1 *local_400;
  long **local_3f8;
  long **local_3e8;
  long **local_3d8;
  long **local_3c8;
  long **local_3b8;
  long **local_3a8;
  long **local_398;
  long **local_388;
  long **local_378;
  long **local_368;
  long **local_358;
  Ref<embree::XML> *local_348;
  long **local_338;
  long **local_328;
  long **local_318;
  Ref<embree::XML> *local_308;
  long **local_2f8;
  long **local_2e8;
  undefined4 *local_2d8;
  undefined4 *local_2d0;
  undefined4 *local_2c8;
  long **local_2c0;
  long **local_2b8;
  long **local_2b0;
  long **local_2a8;
  long **local_2a0;
  long **local_298;
  long **local_290;
  long **local_280;
  SubdivMeshNode *local_270;
  SubdivMeshNode **local_268;
  SubdivMeshNode **local_260;
  SubdivMeshNode **local_258;
  SubdivMeshNode **local_250;
  SubdivMeshNode **local_248;
  SubdivMeshNode **local_240;
  SubdivMeshNode **local_238;
  SubdivMeshNode **local_230;
  SubdivMeshNode **local_228;
  SubdivMeshNode **local_220;
  SubdivMeshNode **local_218;
  SubdivMeshNode **local_210;
  SubdivMeshNode **local_208;
  SubdivMeshNode **local_200;
  SubdivMeshNode **local_1f8;
  SubdivMeshNode **local_1f0;
  SubdivMeshNode **local_1e8;
  SubdivMeshNode **local_1e0;
  SubdivMeshNode **local_1d8;
  SubdivMeshNode **local_1d0;
  SubdivMeshNode **local_1c8;
  SubdivMeshNode **local_1c0;
  SubdivMeshNode *local_1b0;
  SubdivMeshNode **local_1a0;
  ulong local_180;
  undefined1 *local_178;
  ulong local_160;
  undefined1 *local_158;
  ulong local_140;
  undefined1 *local_138;
  ulong local_120;
  undefined1 *local_118;
  ulong local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  undefined1 *local_b0;
  undefined1 *local_80;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined1 *local_20;
  
  local_520 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_550,"material",&local_551);
  XML::child(in_stack_fffffffffffff220,in_stack_fffffffffffff218);
  loadMaterial(in_stack_fffffffffffff428,in_stack_fffffffffffff420);
  local_3f8 = &local_530;
  if (local_530 != (long *)0x0) {
    (**(code **)(*local_530 + 0x18))();
  }
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  pSVar4 = (SubdivMeshNode *)::operator_new(0x1b0);
  local_589 = 1;
  local_298 = &local_578;
  local_2a0 = &local_528;
  local_578 = local_528;
  if (local_528 != (long *)0x0) {
    (**(code **)(*local_528 + 0x10))();
  }
  local_584 = 0;
  local_588 = 0x3f800000;
  local_2c8 = &local_580;
  local_2d0 = &local_584;
  local_2d8 = &local_588;
  local_580 = 0;
  uStack_57c = 0x3f800000;
  SceneGraph::SubdivMeshNode::SubdivMeshNode
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff240,
             in_stack_fffffffffffff228);
  local_589 = 0;
  local_268 = local_570;
  local_270 = pSVar4;
  local_570[0] = pSVar4;
  if (pSVar4 != (SubdivMeshNode *)0x0) {
    (**(code **)(*(long *)&(pSVar4->super_Node).super_RefCount + 0x10))();
  }
  local_290 = &local_578;
  if (local_578 != (long *)0x0) {
    (**(code **)(*local_578 + 0x18))();
  }
  local_490 = local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b8,"animated_positions",&local_5b9);
  XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  local_458 = &local_598;
  if (local_598 == (long *)0x0) {
    local_1d0 = local_570;
    local_498 = local_520;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_638,"positions",&local_639);
    XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
    loadVec3faArray(in_stack_fffffffffffff378,in_stack_fffffffffffff370);
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back(in_stack_fffffffffffff160,in_stack_fffffffffffff158);
    local_440 = local_610;
    for (local_120 = 0; local_120 < local_608; local_120 = local_120 + 1) {
    }
    sVar5 = local_5f8;
    local_118 = local_440;
    local_b0 = local_440;
    alignedFree(in_stack_fffffffffffff158);
    local_5f8 = 0;
    local_600 = 0;
    local_608 = 0;
    local_3d8 = &local_618;
    if (local_618 != (long *)0x0) {
      (**(code **)(*local_618 + 0x18))();
    }
    std::__cxx11::string::~string(local_638);
    std::allocator<char>::~allocator((allocator<char> *)&local_639);
    local_4a0 = local_520;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_660,"positions2",&local_661);
    bVar2 = XML::hasChild(in_stack_fffffffffffff170,in_stack_fffffffffffff168);
    std::__cxx11::string::~string(local_660);
    std::allocator<char>::~allocator((allocator<char> *)&local_661);
    if (bVar2) {
      local_1d8 = local_570;
      local_4a8 = local_520;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6b0,"positions2",&local_6b1);
      XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
      loadVec3faArray(in_stack_fffffffffffff378,in_stack_fffffffffffff370);
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back(in_stack_fffffffffffff160,in_stack_fffffffffffff158);
      local_430 = local_688;
      for (local_140 = 0; local_140 < local_680; local_140 = local_140 + 1) {
      }
      sVar5 = local_670;
      local_138 = local_430;
      local_80 = local_430;
      alignedFree(in_stack_fffffffffffff158);
      local_670 = 0;
      local_678 = 0;
      local_680 = 0;
      local_3c8 = &local_690;
      if (local_690 != (long *)0x0) {
        (**(code **)(*local_690 + 0x18))();
      }
      std::__cxx11::string::~string(local_6b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
    }
  }
  else {
    local_5c8 = 0;
    while( true ) {
      uVar1 = local_5c8;
      local_2a8 = &local_598;
      sVar5 = XML::size((XML *)0x3a3ea4);
      if (sVar5 <= uVar1) break;
      local_1c8 = local_570;
      local_2b0 = &local_598;
      XML::child(in_stack_fffffffffffff248,(size_t)in_stack_fffffffffffff240);
      loadVec3faArray(in_stack_fffffffffffff378,in_stack_fffffffffffff370);
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back(in_stack_fffffffffffff160,in_stack_fffffffffffff158);
      local_450 = local_5e8;
      for (local_100 = 0; local_100 < local_5e0; local_100 = local_100 + 1) {
      }
      local_f0 = local_5d8;
      local_e8 = local_5d0;
      local_f8 = local_450;
      local_e0 = local_450;
      alignedFree(in_stack_fffffffffffff158);
      local_5d0 = 0;
      local_5d8 = 0;
      local_5e0 = 0;
      local_3e8 = &local_5f0;
      if (local_5f0 != (long *)0x0) {
        (**(code **)(*local_5f0 + 0x18))();
      }
      local_5c8 = local_5c8 + 1;
    }
  }
  local_3b8 = &local_598;
  if (local_598 != (long *)0x0) {
    (**(code **)(*local_598 + 0x18))();
  }
  local_4b0 = local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"animated_normals",&local_6e1);
  XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  local_460 = &local_6c0;
  if (local_6c0 == (long *)0x0) {
    local_4b8 = local_520;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_740,"normals",&local_741);
    XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
    std::__cxx11::string::~string(local_740);
    std::allocator<char>::~allocator((allocator<char> *)&local_741);
    local_468 = &local_720;
    if (local_720 != (long *)0x0) {
      loadVec3faArray(in_stack_fffffffffffff378,in_stack_fffffffffffff370);
      local_400 = local_768;
      if (local_760 != 0) {
        local_770 = 0;
        while( true ) {
          uVar1 = local_770;
          local_1e8 = local_570;
          sVar5 = SceneGraph::SubdivMeshNode::numTimeSteps((SubdivMeshNode *)0x3a5299);
          if (sVar5 <= uVar1) break;
          local_1f0 = local_570;
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                       *)in_stack_fffffffffffff170,(value_type *)in_stack_fffffffffffff168);
          local_770 = local_770 + 1;
        }
      }
      local_410 = local_768;
      for (local_180 = 0; local_180 < local_760; local_180 = local_180 + 1) {
      }
      sVar5 = local_750;
      local_178 = local_410;
      local_20 = local_410;
      alignedFree(in_stack_fffffffffffff158);
      local_750 = 0;
      local_758 = 0;
      local_760 = 0;
    }
    local_398 = &local_720;
    if (local_720 != (long *)0x0) {
      (**(code **)(*local_720 + 0x18))();
    }
  }
  else {
    local_6f0 = 0;
    while( true ) {
      uVar1 = local_6f0;
      local_2b8 = &local_6c0;
      sVar5 = XML::size((XML *)0x3a4d3c);
      if (sVar5 <= uVar1) break;
      local_1e0 = local_570;
      local_2c0 = &local_6c0;
      XML::child(in_stack_fffffffffffff248,(size_t)in_stack_fffffffffffff240);
      loadVec3faArray(in_stack_fffffffffffff378,in_stack_fffffffffffff370);
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back(in_stack_fffffffffffff160,in_stack_fffffffffffff158);
      local_420 = local_710;
      for (local_160 = 0; local_160 < local_708; local_160 = local_160 + 1) {
      }
      local_60 = local_700;
      local_58 = local_6f8;
      local_158 = local_420;
      local_50 = local_420;
      alignedFree(in_stack_fffffffffffff158);
      local_6f8 = 0;
      local_700 = 0;
      local_708 = 0;
      local_3a8 = &local_718;
      if (local_718 != (long *)0x0) {
        (**(code **)(*local_718 + 0x18))();
      }
      local_6f0 = local_6f0 + 1;
    }
  }
  local_388 = &local_6c0;
  if (local_6c0 != (long *)0x0) {
    (**(code **)(*local_6c0 + 0x18))();
  }
  local_4c0 = local_520;
  paVar6 = &local_7b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"texcoords",paVar6);
  XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  loadVec2fArray(in_stack_fffffffffffff288,in_stack_fffffffffffff280);
  local_1f8 = local_570;
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::operator=
            ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
             in_stack_fffffffffffff170,
             (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
             in_stack_fffffffffffff168);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::~vector
            ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
             in_stack_fffffffffffff170);
  local_378 = local_790;
  if (local_790[0] != (long *)0x0) {
    (**(code **)(*local_790[0] + 0x18))();
  }
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  local_4c8 = local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e0,"position_indices",&local_7e1);
  XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::__cxx11::string::~string(local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
  local_470 = &local_7c0;
  if (local_7c0 != (long *)0x0) {
    loadUIntArray(in_stack_fffffffffffff208,in_stack_fffffffffffff200);
    local_200 = local_570;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff170,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff168);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff170);
    RVar3 = parseSubdivMode(in_stack_fffffffffffff1f0);
    local_208 = local_570;
    sVar5 = (size_t)RVar3;
    local_570[0]->position_subdiv_mode = RVar3;
  }
  local_368 = &local_7c0;
  if (local_7c0 != (long *)0x0) {
    (**(code **)(*local_7c0 + 0x18))();
  }
  local_4d0 = local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_828,"normal_indices",&local_829);
  XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::__cxx11::string::~string(local_828);
  std::allocator<char>::~allocator((allocator<char> *)&local_829);
  local_478 = local_808;
  if (local_808[0] != (long *)0x0) {
    loadUIntArray(in_stack_fffffffffffff208,in_stack_fffffffffffff200);
    local_210 = local_570;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff170,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff168);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff170);
    RVar3 = parseSubdivMode(in_stack_fffffffffffff1f0);
    local_218 = local_570;
    sVar5 = (size_t)RVar3;
    local_570[0]->normal_subdiv_mode = RVar3;
  }
  local_358 = local_808;
  if (local_808[0] != (long *)0x0) {
    (**(code **)(*local_808[0] + 0x18))();
  }
  local_4d8 = local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_870,"texcoord_indices",&local_871);
  XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator((allocator<char> *)&local_871);
  local_480 = local_850;
  if (local_850[0].ptr != (XML *)0x0) {
    loadUIntArray(in_stack_fffffffffffff208,in_stack_fffffffffffff200);
    local_220 = local_570;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff170,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff168);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff170);
    RVar3 = parseSubdivMode(in_stack_fffffffffffff1f0);
    local_228 = local_570;
    sVar5 = (size_t)RVar3;
    local_570[0]->texcoord_subdiv_mode = RVar3;
  }
  pRVar7 = local_850;
  local_348 = pRVar7;
  if (local_850[0].ptr != (XML *)0x0) {
    (*((local_850[0].ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  local_4e0 = local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d0,"faces",&local_8d1);
  XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  loadUIntArray(in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  local_230 = local_570;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff170,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff168);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff170);
  local_338 = local_8b0;
  if (local_8b0[0] != (long *)0x0) {
    (**(code **)(*local_8b0[0] + 0x18))();
  }
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  local_4e8 = local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_918,"holes",&local_919);
  XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  loadUIntArray(in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  local_238 = local_570;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff170,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff168);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff170);
  local_328 = local_8f8;
  if (local_8f8[0] != (long *)0x0) {
    (**(code **)(*local_8f8[0] + 0x18))();
  }
  std::__cxx11::string::~string(local_918);
  std::allocator<char>::~allocator((allocator<char> *)&local_919);
  local_4f0 = local_520;
  paVar6 = &local_961;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_960,"edge_creases",paVar6);
  XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  loadVec2iArray(in_stack_fffffffffffff288,pRVar7);
  local_240 = local_570;
  std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::operator=
            ((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)
             in_stack_fffffffffffff170,
             (vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)
             in_stack_fffffffffffff168);
  std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::~vector
            ((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)
             in_stack_fffffffffffff170);
  local_318 = local_940;
  if (local_940[0] != (long *)0x0) {
    (**(code **)(*local_940[0] + 0x18))();
  }
  std::__cxx11::string::~string(local_960);
  std::allocator<char>::~allocator((allocator<char> *)&local_961);
  local_4f8 = local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9a8,"edge_crease_weights",&local_9a9);
  XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  loadFloatArray(in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  local_248 = local_570;
  pSVar4 = local_570[0];
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff170,
             (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff168);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff170);
  pRVar7 = local_988;
  local_308 = pRVar7;
  if (local_988[0].ptr != (XML *)0x0) {
    (*((local_988[0].ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_9a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
  local_500 = local_520;
  paVar6 = &local_9f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f0,"vertex_creases",paVar6);
  XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  loadUIntArray((XMLLoader *)pSVar4,pRVar7);
  local_250 = local_570;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff170,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff168);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff170);
  local_2f8 = local_9d0;
  if (local_9d0[0] != (long *)0x0) {
    (**(code **)(*local_9d0[0] + 0x18))();
  }
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  local_508 = local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a38,"vertex_crease_weights",&local_a39);
  XML::childOpt(in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  loadFloatArray((XMLLoader *)pSVar4,pRVar7);
  local_258 = local_570;
  ctx = local_a10;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff170,
             (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff168);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff170);
  local_2e8 = &local_a18;
  if (local_a18 != (long *)0x0) {
    (**(code **)(*local_a18 + 0x18))();
  }
  std::__cxx11::string::~string(local_a38);
  std::allocator<char>::~allocator((allocator<char> *)&local_a39);
  local_260 = local_570;
  SceneGraph::SubdivMeshNode::verify(local_570[0],ctx,sig,sVar5,in_R8,in_R9);
  local_1c0 = local_570;
  local_1b0 = local_570[0];
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)local_570[0];
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_1a0 = local_570;
  if (local_570[0] != (SubdivMeshNode *)0x0) {
    (*(local_570[0]->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_280 = &local_528;
  if (local_528 != (long *)0x0) {
    (**(code **)(*local_528 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadSubdivMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) 
        mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions2")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
    }
    else if (Ref<XML> normalbuf = xml->childOpt("normals")) {
      auto vec = loadVec3faArray(normalbuf);
      if (vec.size())
        for (size_t i=0; i<mesh->numTimeSteps(); i++)
          mesh->normals.push_back(vec);
    }
    
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoords"));

    if (Ref<XML> child = xml->childOpt("position_indices")) {
      mesh->position_indices = loadUIntArray(child);
      mesh->position_subdiv_mode = parseSubdivMode(child);
    }
    if (Ref<XML> child = xml->childOpt("normal_indices")) {
      mesh->normal_indices   = loadUIntArray(child);
      mesh->normal_subdiv_mode = parseSubdivMode(child);
    }
    if (Ref<XML> child = xml->childOpt("texcoord_indices")) {
      mesh->texcoord_indices = loadUIntArray(child);
      mesh->texcoord_subdiv_mode = parseSubdivMode(child);
    }

    mesh->verticesPerFace  = loadUIntArray(xml->childOpt("faces"));
    mesh->holes            = loadUIntArray(xml->childOpt("holes"));
    mesh->edge_creases     = loadVec2iArray(xml->childOpt("edge_creases"));
    mesh->edge_crease_weights = loadFloatArray(xml->childOpt("edge_crease_weights"));
    mesh->vertex_creases      = loadUIntArray(xml->childOpt("vertex_creases"));
    mesh->vertex_crease_weights = loadFloatArray(xml->childOpt("vertex_crease_weights"));
    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }